

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID,BBox1f time_range)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar17 [64];
  float fVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  vfloat4 a0;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [12];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  auVar17._8_56_ = in_register_00001208;
  auVar17._0_8_ = time_range;
  BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = BVar1.lower;
  auVar13._4_4_ = BVar1.upper;
  fVar22 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar18 = BVar1.lower;
  auVar13 = vmovshdup_avx(auVar13);
  fVar32 = auVar13._0_4_ - fVar18;
  auVar16 = vmovshdup_avx(auVar17._0_16_);
  auVar13 = ZEXT416((uint)(fVar22 * ((time_range.lower - fVar18) / fVar32) * 1.0000002));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  auVar13 = vmaxss_avx(ZEXT816(0),auVar13);
  auVar16 = ZEXT416((uint)(fVar22 * ((auVar16._0_4_ - fVar18) / fVar32) * 0.99999976));
  auVar16 = vroundss_avx(auVar16,auVar16,10);
  auVar16 = vminss_avx(auVar16,ZEXT416((uint)fVar22));
  if ((int)auVar16._0_4_ == (int)auVar13._0_4_) {
    auVar13 = vdpps_avx(_DAT_01fb04e0,_DAT_01fb04e0,0x7f);
    auVar23 = SUB6416(ZEXT464(0xbf800000),0);
    auVar16 = vdpps_avx(auVar23,auVar23,0x7f);
    uVar6 = vcmpps_avx512vl(auVar16,auVar13,1);
    auVar13 = vpmovm2d_avx512vl(uVar6);
    auVar14._0_4_ = auVar13._0_4_;
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    uVar11 = vpmovd2m_avx512vl(auVar14);
    auVar13 = vpcmpeqd_avx(auVar14,auVar14);
    auVar12._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar13._4_4_;
    auVar12._0_4_ = (uint)((byte)uVar11 & 1) * auVar13._0_4_;
    auVar12._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar13._8_4_;
    auVar12._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar13._12_4_;
    auVar13 = vblendvps_avx(auVar23,_DAT_01fb04e0,auVar12);
    auVar16 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar12 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar16._0_4_));
    fVar22 = auVar12._0_4_;
    fVar22 = fVar22 * 1.5 - auVar16._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
    aVar19._0_4_ = auVar13._0_4_ * fVar22;
    aVar19._4_4_ = auVar13._4_4_ * fVar22;
    aVar19._8_4_ = auVar13._8_4_ * fVar22;
    aVar19._12_4_ = auVar13._12_4_ * fVar22;
    auVar13 = vshufps_avx((undefined1  [16])aVar19,(undefined1  [16])aVar19,0xc9);
    auVar23._0_4_ = aVar19._0_4_ * -0.0;
    auVar23._4_4_ = aVar19._4_4_ * -1.0;
    auVar23._8_4_ = aVar19._8_4_ * -0.0;
    auVar23._12_4_ = aVar19._12_4_ * -0.0;
    auVar13 = vfmadd231ps_fma(auVar23,_DAT_01f7b700,auVar13);
    auVar16 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vdpps_avx(auVar16,auVar16,0x7f);
    auVar12 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar13._0_4_));
    fVar22 = auVar12._0_4_;
    fVar22 = fVar22 * 1.5 - auVar13._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
    aVar24._0_4_ = fVar22 * auVar16._0_4_;
    aVar24._4_4_ = fVar22 * auVar16._4_4_;
    aVar24._8_4_ = fVar22 * auVar16._8_4_;
    aVar24._12_4_ = fVar22 * auVar16._12_4_;
    auVar16 = _DAT_01f7b700;
  }
  else {
    iVar8 = ((int)auVar13._0_4_ + (int)auVar16._0_4_) / 2;
    pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar4 = pBVar3[iVar8].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[iVar8].super_RawBufferView.stride;
    lVar9 = (uVar2 + 1) * sVar5;
    lVar10 = (uVar2 + 2) * sVar5;
    lVar7 = (uVar2 + 3) * sVar5;
    fVar22 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar9),
                            ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar9 + 0xc))),0x30);
    auVar14 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar10),
                            ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar10 + 0xc))),0x30);
    auVar26._0_12_ = ZEXT812(0);
    auVar26._12_4_ = 0;
    auVar23 = vsubps_avx(auVar14,auVar12);
    auVar13 = vdpps_avx(auVar23,auVar23,0x7f);
    fVar18 = auVar13._0_4_;
    auVar36._4_8_ = auVar26._4_8_;
    auVar36._0_4_ = fVar18;
    auVar36._12_4_ = 0;
    auVar13 = vrsqrt14ss_avx512f(auVar26,auVar36);
    fVar32 = auVar13._0_4_;
    fVar32 = fVar32 * 1.5 + fVar18 * -0.5 * fVar32 * fVar32 * fVar32;
    auVar16._0_4_ = auVar23._0_4_ * fVar32;
    auVar16._4_4_ = auVar23._4_4_ * fVar32;
    auVar16._8_4_ = auVar23._8_4_ * fVar32;
    auVar16._12_4_ = auVar23._12_4_ * fVar32;
    if (1e-18 < fVar18) {
      auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5),
                              ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc))),
                              0x30);
      auVar23 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                              ZEXT416((uint)(fVar22 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
      auVar33._0_4_ = auVar23._0_4_ * 0.0;
      auVar33._4_4_ = auVar23._4_4_ * 0.0;
      auVar33._8_4_ = auVar23._8_4_ * 0.0;
      auVar33._12_4_ = auVar23._12_4_ * 0.0;
      auVar37._8_4_ = 0xbf000000;
      auVar37._0_8_ = 0xbf000000bf000000;
      auVar37._12_4_ = 0xbf000000;
      auVar14 = vfnmadd213ps_fma(auVar14,auVar37,auVar33);
      auVar12 = vfmadd213ps_fma(auVar12,auVar26,auVar14);
      auVar14 = vfmadd231ps_fma(auVar12,auVar37,auVar13);
      auVar13 = vshufps_avx(auVar14,auVar14,0xc9);
      auVar12 = vshufps_avx(auVar16,auVar16,0xc9);
      auVar20._0_4_ = auVar14._0_4_ * auVar12._0_4_;
      auVar20._4_4_ = auVar14._4_4_ * auVar12._4_4_;
      auVar20._8_4_ = auVar14._8_4_ * auVar12._8_4_;
      auVar20._12_4_ = auVar14._12_4_ * auVar12._12_4_;
      auVar13 = vfmsub231ps_fma(auVar20,auVar16,auVar13);
      auVar13 = vshufps_avx(auVar13,auVar13,0xc9);
    }
    else {
      auVar13 = ZEXT816(0x3f80000000000000);
      auVar16 = _DAT_01f7b700;
    }
    auVar12 = vdpps_avx(auVar13,auVar13,0x7f);
    fVar22 = auVar12._0_4_;
    if (fVar22 <= 1e-18) {
      auVar12 = vshufpd_avx(auVar16,auVar16,1);
      auVar13 = vmovshdup_avx(auVar16);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar25._0_4_ = auVar13._0_4_ ^ 0x80000000;
      auVar31 = ZEXT812(0) << 0x20;
      auVar26 = ZEXT816(0) << 0x40;
      auVar13 = vunpckhps_avx(auVar16,auVar26);
      auVar25._4_12_ = auVar31;
      auVar23 = vshufps_avx(auVar13,auVar25,0x41);
      auVar13 = vdpps_avx(auVar23,auVar23,0x7f);
      auVar21._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar21._8_8_ = auVar12._8_8_ ^ auVar27._8_8_;
      auVar14 = vinsertps_avx(auVar21,auVar16,0x2a);
      auVar12 = vdpps_avx(auVar14,auVar14,0x7f);
      uVar6 = vcmpps_avx512vl(auVar12,auVar13,1);
      auVar13 = vpmovm2d_avx512vl(uVar6);
      auVar28._0_4_ = auVar13._0_4_;
      auVar28._4_4_ = auVar28._0_4_;
      auVar28._8_4_ = auVar28._0_4_;
      auVar28._12_4_ = auVar28._0_4_;
      uVar11 = vpmovd2m_avx512vl(auVar28);
      auVar13 = vpcmpeqd_avx(auVar28,auVar28);
      auVar15._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar13._4_4_;
      auVar15._0_4_ = (uint)((byte)uVar11 & 1) * auVar13._0_4_;
      auVar15._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar13._8_4_;
      auVar15._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar13._12_4_;
      auVar13 = vblendvps_avx(auVar14,auVar23,auVar15);
      auVar12 = vdpps_avx(auVar13,auVar13,0x7f);
      auVar29._4_12_ = auVar31;
      auVar29._0_4_ = auVar12._0_4_;
      auVar14 = vrsqrt14ss_avx512f(auVar26,auVar29);
      fVar22 = auVar14._0_4_;
      fVar22 = fVar22 * 1.5 - auVar12._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar19._0_4_ = auVar13._0_4_ * fVar22;
      aVar19._4_4_ = auVar13._4_4_ * fVar22;
      aVar19._8_4_ = auVar13._8_4_ * fVar22;
      aVar19._12_4_ = auVar13._12_4_ * fVar22;
      auVar13 = vshufps_avx((undefined1  [16])aVar19,(undefined1  [16])aVar19,0xc9);
      auVar12 = vshufps_avx(auVar16,auVar16,0xc9);
      auVar30._0_4_ = aVar19._0_4_ * auVar12._0_4_;
      auVar30._4_4_ = aVar19._4_4_ * auVar12._4_4_;
      auVar30._8_4_ = aVar19._8_4_ * auVar12._8_4_;
      auVar30._12_4_ = aVar19._12_4_ * auVar12._12_4_;
      auVar13 = vfmsub231ps_fma(auVar30,auVar16,auVar13);
      auVar12 = vshufps_avx(auVar13,auVar13,0xc9);
      auVar13 = vdpps_avx(auVar12,auVar12,0x7f);
      auVar39._4_12_ = auVar31;
      auVar39._0_4_ = auVar13._0_4_;
      auVar14 = vrsqrt14ss_avx512f(auVar26,auVar39);
      fVar22 = auVar14._0_4_;
      fVar22 = fVar22 * 1.5 - auVar13._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar24._0_4_ = fVar22 * auVar12._0_4_;
      aVar24._4_4_ = fVar22 * auVar12._4_4_;
      aVar24._8_4_ = fVar22 * auVar12._8_4_;
      aVar24._12_4_ = fVar22 * auVar12._12_4_;
    }
    else {
      auVar31 = SUB1612(ZEXT416(0),0) << 0x20;
      auVar14 = ZEXT416(0) << 0x40;
      auVar34._4_12_ = auVar31;
      auVar34._0_4_ = fVar22;
      auVar12 = vrsqrt14ss_avx512f(auVar14,auVar34);
      fVar32 = auVar12._0_4_;
      fVar22 = fVar32 * 1.5 - fVar22 * 0.5 * fVar32 * fVar32 * fVar32;
      aVar24._0_4_ = auVar13._0_4_ * fVar22;
      aVar24._4_4_ = auVar13._4_4_ * fVar22;
      aVar24._8_4_ = auVar13._8_4_ * fVar22;
      aVar24._12_4_ = auVar13._12_4_ * fVar22;
      auVar13 = vshufps_avx(auVar16,auVar16,0xc9);
      auVar12 = vshufps_avx((undefined1  [16])aVar24,(undefined1  [16])aVar24,0xc9);
      auVar35._0_4_ = auVar16._0_4_ * auVar12._0_4_;
      auVar35._4_4_ = auVar16._4_4_ * auVar12._4_4_;
      auVar35._8_4_ = auVar16._8_4_ * auVar12._8_4_;
      auVar35._12_4_ = auVar16._12_4_ * auVar12._12_4_;
      auVar13 = vfmsub231ps_fma(auVar35,(undefined1  [16])aVar24,auVar13);
      auVar12 = vshufps_avx(auVar13,auVar13,0xc9);
      auVar13 = vdpps_avx(auVar12,auVar12,0x7f);
      auVar38._4_12_ = auVar31;
      auVar38._0_4_ = auVar13._0_4_;
      auVar14 = vrsqrt14ss_avx512f(auVar14,auVar38);
      fVar22 = auVar14._0_4_;
      fVar22 = fVar22 * 1.5 - auVar13._0_4_ * 0.5 * fVar22 * fVar22 * fVar22;
      aVar19._0_4_ = fVar22 * auVar12._0_4_;
      aVar19._4_4_ = fVar22 * auVar12._4_4_;
      aVar19._8_4_ = fVar22 * auVar12._8_4_;
      aVar19._12_4_ = fVar22 * auVar12._12_4_;
    }
  }
  (__return_storage_ptr__->vx).field_0 = aVar19;
  (__return_storage_ptr__->vy).field_0 = aVar24;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar16;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }